

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

tm * __thiscall fmt::v5::gmtime(v5 *this,time_t *__timer)

{
  bool bVar1;
  format_error *this_00;
  dispatcher gt;
  
  gt.time_ = (time_t)__timer;
  bVar1 = gmtime::dispatcher::run(&gt);
  if (bVar1) {
    *(char **)(this + 0x30) = gt.tm_.tm_zone;
    *(undefined8 *)(this + 0x20) = gt.tm_._32_8_;
    *(long *)(this + 0x28) = gt.tm_.tm_gmtoff;
    *(undefined8 *)(this + 0x10) = gt.tm_._16_8_;
    *(undefined8 *)(this + 0x18) = gt.tm_._24_8_;
    *(undefined8 *)this = gt.tm_._0_8_;
    *(undefined8 *)(this + 8) = gt.tm_._8_8_;
    return (tm *)this;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"time_t value out of range");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::tm gmtime(std::time_t time) {
  struct dispatcher {
    std::time_t time_;
    std::tm tm_;

    dispatcher(std::time_t t): time_(t) {}

    bool run() {
      using namespace fmt::internal;
      return handle(gmtime_r(&time_, &tm_));
    }

    bool handle(std::tm *tm) { return tm != FMT_NULL; }

    bool handle(internal::null<>) {
      using namespace fmt::internal;
      return fallback(gmtime_s(&tm_, &time_));
    }

    bool fallback(int res) { return res == 0; }

#if !FMT_MSC_VER
    bool fallback(internal::null<>) {
      std::tm *tm = std::gmtime(&time_);
      if (tm) tm_ = *tm;
      return tm != FMT_NULL;
    }
#endif
  };
  dispatcher gt(time);
  // Too big time values may be unsupported.
  if (!gt.run())
    FMT_THROW(format_error("time_t value out of range"));
  return gt.tm_;
}